

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindExtension
          (AggregateOptionFinder *this,Message *message,string *name)

{
  FieldDescriptor *this_00;
  long lVar1;
  int iVar2;
  Type TVar3;
  undefined4 extraout_var;
  Symbol SVar5;
  Descriptor *pDVar6;
  long lVar7;
  int i;
  long lVar8;
  Descriptor *foreign_type;
  Symbol SVar9;
  long lVar4;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  lVar4 = CONCAT44(extraout_var,iVar2);
  SVar5 = LookupSymbolNoPlaceholder
                    (this->builder_,name,(string *)(*(long *)(lVar4 + 8) + 0x20),LOOKUP_ALL,true);
  SVar9.ptr_ = (SymbolBase *)(FieldDescriptor *)0x0;
  if ((SVar5.ptr_ != (SymbolBase *)0x0) && (SVar9 = SVar5, (SVar5.ptr_)->symbol_type_ != '\x02')) {
    if (((SVar5.ptr_)->symbol_type_ == '\x01') &&
       (*(char *)(*(long *)(lVar4 + 0x20) + 0x48) == '\x01')) {
      lVar7 = 0;
      for (lVar8 = 0; lVar8 < *(int *)(SVar5.ptr_ + 0x7c); lVar8 = lVar8 + 1) {
        lVar1 = *(long *)(SVar5.ptr_ + 0x50);
        if (*(long *)(lVar1 + 0x20 + lVar7) == lVar4) {
          this_00 = (FieldDescriptor *)(lVar7 + lVar1);
          TVar3 = FieldDescriptor::type(this_00);
          if (((TVar3 == TYPE_MESSAGE) && ((*(byte *)(lVar1 + 1 + lVar7) & 0x60) == 0x20)) &&
             (pDVar6 = FieldDescriptor::message_type(this_00), pDVar6 == (Descriptor *)SVar5.ptr_))
          {
            return this_00;
          }
        }
        lVar7 = lVar7 + 0x48;
      }
    }
    SVar9.ptr_ = (SymbolBase *)(FieldDescriptor *)0x0;
  }
  return (FieldDescriptor *)SVar9.ptr_;
}

Assistant:

const FieldDescriptor* FindExtension(Message* message,
                                       const std::string& name) const override {
    assert_mutex_held(builder_->pool_);
    const Descriptor* descriptor = message->GetDescriptor();
    Symbol result =
        builder_->LookupSymbolNoPlaceholder(name, descriptor->full_name());
    if (auto* field = result.field_descriptor()) {
      return field;
    } else if (result.type() == Symbol::MESSAGE &&
               descriptor->options().message_set_wire_format()) {
      const Descriptor* foreign_type = result.descriptor();
      // The text format allows MessageSet items to be specified using
      // the type name, rather than the extension identifier. If the symbol
      // lookup returned a Message, and the enclosing Message has
      // message_set_wire_format = true, then return the message set
      // extension, if one exists.
      for (int i = 0; i < foreign_type->extension_count(); i++) {
        const FieldDescriptor* extension = foreign_type->extension(i);
        if (extension->containing_type() == descriptor &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == foreign_type) {
          // Found it.
          return extension;
        }
      }
    }
    return nullptr;
  }